

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

bool __thiscall
cmUuid::StringToBinary
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  size_type sVar4;
  char *pcVar5;
  const_reference pvVar6;
  string local_60;
  long local_40;
  size_t digits;
  size_t i;
  size_t index;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output_local;
  string *input_local;
  cmUuid *this_local;
  
  index = (size_t)output;
  output_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)input;
  input_local = (string *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(output);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)index,0x10);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0x24) {
    i = 0;
    for (digits = 0; sVar1 = digits,
        sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->Groups), sVar1 < sVar4;
        digits = digits + 1) {
      if (digits != 0) {
        i = i + 1;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)output_local);
        if (*pcVar5 != '-') {
          return false;
        }
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->Groups,digits);
      local_40 = (long)(*pvVar6 * 2);
      std::__cxx11::string::substr((ulong)&local_60,(ulong)output_local);
      bVar2 = StringToBinaryImpl(this,&local_60,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)index);
      std::__cxx11::string::~string((string *)&local_60);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return false;
      }
      i = local_40 + i;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmUuid::StringToBinary(std::string const& input,
  std::vector<unsigned char> &output) const
{
  output.clear();
  output.reserve(16);

  if(input.length() != 36)
    {
    return false;
    }
  size_t index = 0;
  for(size_t i = 0; i < this->Groups.size(); ++i)
    {
    if(i != 0 && input[index++] != '-')
      {
      return false;
      }
    size_t digits = this->Groups[i] * 2;
    if(!StringToBinaryImpl(input.substr(index, digits), output))
      {
      return false;
      }

    index += digits;
    }

  return true;
}